

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse4.c
# Opt level: O1

int aom_vector_var_sse4_1(int16_t *ref,int16_t *src,int bwl)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  int iVar4;
  long lVar5;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar6 [16];
  short sVar13;
  undefined1 auVar14 [16];
  int iVar16;
  int iVar17;
  undefined1 auVar15 [16];
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  iVar4 = 4 << ((byte)bwl & 0x1f);
  if (iVar4 < 1) {
    auVar6 = (undefined1  [16])0x0;
    auVar15 = (undefined1  [16])0x0;
  }
  else {
    auVar15 = (undefined1  [16])0x0;
    auVar6 = (undefined1  [16])0x0;
    lVar5 = 0;
    do {
      psVar1 = src + lVar5;
      psVar3 = src + lVar5 + 8;
      psVar2 = ref + lVar5;
      auVar19._0_2_ = *psVar2 - *psVar1;
      auVar19._2_2_ = psVar2[1] - psVar1[1];
      auVar19._4_2_ = psVar2[2] - psVar1[2];
      auVar19._6_2_ = psVar2[3] - psVar1[3];
      auVar19._8_2_ = psVar2[4] - psVar1[4];
      auVar19._10_2_ = psVar2[5] - psVar1[5];
      auVar19._12_2_ = psVar2[6] - psVar1[6];
      auVar19._14_2_ = psVar2[7] - psVar1[7];
      psVar1 = ref + lVar5 + 8;
      auVar14._0_2_ = *psVar1 - *psVar3;
      auVar14._2_2_ = psVar1[1] - psVar3[1];
      auVar14._4_2_ = psVar1[2] - psVar3[2];
      auVar14._6_2_ = psVar1[3] - psVar3[3];
      auVar14._8_2_ = psVar1[4] - psVar3[4];
      auVar14._10_2_ = psVar1[5] - psVar3[5];
      auVar14._12_2_ = psVar1[6] - psVar3[6];
      auVar14._14_2_ = psVar1[7] - psVar3[7];
      sVar7 = auVar6._2_2_;
      sVar8 = auVar6._4_2_;
      sVar9 = auVar6._6_2_;
      sVar10 = auVar6._8_2_;
      sVar11 = auVar6._10_2_;
      sVar12 = auVar6._12_2_;
      sVar13 = auVar6._14_2_;
      auVar20 = pmaddwd(auVar19,auVar19);
      iVar16 = auVar15._4_4_;
      iVar17 = auVar15._8_4_;
      iVar18 = auVar15._12_4_;
      auVar6._0_2_ = auVar6._0_2_ + auVar19._0_2_ + auVar14._0_2_;
      auVar6._2_2_ = sVar7 + auVar19._2_2_ + auVar14._2_2_;
      auVar6._4_2_ = sVar8 + auVar19._4_2_ + auVar14._4_2_;
      auVar6._6_2_ = sVar9 + auVar19._6_2_ + auVar14._6_2_;
      auVar6._8_2_ = sVar10 + auVar19._8_2_ + auVar14._8_2_;
      auVar6._10_2_ = sVar11 + auVar19._10_2_ + auVar14._10_2_;
      auVar6._12_2_ = sVar12 + auVar19._12_2_ + auVar14._12_2_;
      auVar6._14_2_ = sVar13 + auVar19._14_2_ + auVar14._14_2_;
      auVar14 = pmaddwd(auVar14,auVar14);
      auVar15._0_4_ = auVar14._0_4_ + auVar20._0_4_ + auVar15._0_4_;
      auVar15._4_4_ = auVar14._4_4_ + auVar20._4_4_ + iVar16;
      auVar15._8_4_ = auVar14._8_4_ + auVar20._8_4_ + iVar17;
      auVar15._12_4_ = auVar14._12_4_ + auVar20._12_4_ + iVar18;
      lVar5 = lVar5 + 0x10;
    } while ((int)lVar5 < iVar4);
  }
  auVar6 = pmaddwd(auVar6,_DAT_0050f120);
  auVar6 = phaddd(auVar6,auVar15);
  auVar6 = phaddd(auVar6,auVar6);
  return auVar6._12_4_ - ((uint)(auVar6._0_4_ * auVar6._0_4_) >> ((byte)bwl + 2 & 0x1f));
}

Assistant:

int aom_vector_var_sse4_1(const int16_t *ref, const int16_t *src, int bwl) {
  const int width = 4 << bwl;
  assert(width % 16 == 0);

  const __m128i k_one_epi16 = _mm_set1_epi16((int16_t)1);
  __m128i mean = _mm_setzero_si128();
  __m128i sse = _mm_setzero_si128();

  for (int i = 0; i < width; i += 16) {
    const __m128i src_line = _mm_loadu_si128((const __m128i *)src);
    const __m128i ref_line = _mm_loadu_si128((const __m128i *)ref);
    const __m128i src_line2 = _mm_loadu_si128((const __m128i *)(src + 8));
    const __m128i ref_line2 = _mm_loadu_si128((const __m128i *)(ref + 8));
    __m128i diff = _mm_sub_epi16(ref_line, src_line);
    const __m128i diff2 = _mm_sub_epi16(ref_line2, src_line2);
    __m128i diff_sqr = _mm_madd_epi16(diff, diff);
    const __m128i diff_sqr2 = _mm_madd_epi16(diff2, diff2);

    diff = _mm_add_epi16(diff, diff2);
    diff_sqr = _mm_add_epi32(diff_sqr, diff_sqr2);
    sse = _mm_add_epi32(sse, diff_sqr);
    mean = _mm_add_epi16(mean, diff);

    src += 16;
    ref += 16;
  }

  // m0 m1 m2 m3
  mean = _mm_madd_epi16(mean, k_one_epi16);
  // m0+m1 m2+m3 s0+s1 s2+s3
  __m128i result = _mm_hadd_epi32(mean, sse);
  // m0+m1+m2+m3 s0+s1+s2+s3 x x
  result = _mm_add_epi32(result, _mm_bsrli_si128(result, 4));

  // (mean * mean): dynamic range 31 bits.
  const int mean_int = _mm_extract_epi32(result, 0);
  const int sse_int = _mm_extract_epi32(result, 2);
  const unsigned int mean_abs = abs(mean_int);
  const int var = sse_int - ((mean_abs * mean_abs) >> (bwl + 2));
  return var;
}